

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  char *pcVar5;
  
  lVar1 = source->version_max;
  dest->version = source->version;
  dest->version_max = lVar1;
  _Var4 = source->verifyhost;
  _Var2 = source->verifystatus;
  _Var3 = source->sessionid;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = _Var4;
  dest->verifystatus = _Var2;
  dest->sessionid = _Var3;
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
LAB_0014593e:
    if (source->CAfile == (char *)0x0) {
      dest->CAfile = (char *)0x0;
    }
    else {
      pcVar5 = (*Curl_cstrdup)(source->CAfile);
      dest->CAfile = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001459e4;
    }
    if (source->clientcert == (char *)0x0) {
      dest->clientcert = (char *)0x0;
    }
    else {
      pcVar5 = (*Curl_cstrdup)(source->clientcert);
      dest->clientcert = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001459e4;
    }
    if (source->random_file == (char *)0x0) {
      dest->random_file = (char *)0x0;
    }
    else {
      pcVar5 = (*Curl_cstrdup)(source->random_file);
      dest->random_file = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001459e4;
    }
    if (source->egdsocket == (char *)0x0) {
      dest->egdsocket = (char *)0x0;
    }
    else {
      pcVar5 = (*Curl_cstrdup)(source->egdsocket);
      dest->egdsocket = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001459e4;
    }
    if (source->cipher_list == (char *)0x0) {
      dest->cipher_list = (char *)0x0;
    }
    else {
      pcVar5 = (*Curl_cstrdup)(source->cipher_list);
      dest->cipher_list = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001459e4;
    }
    _Var4 = true;
  }
  else {
    pcVar5 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar5;
    if (pcVar5 != (char *)0x0) goto LAB_0014593e;
LAB_001459e4:
    _Var4 = false;
  }
  return _Var4;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);

  return TRUE;
}